

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rhombicLattice.cpp
# Opt level: O0

void __thiscall RhombicLattice::createUpEdgesMap(RhombicLattice *this)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  bool bVar1;
  int iVar2;
  long *in_RDI;
  cartesian4 cVar3;
  __enable_if_t<is_constructible<value_type,_pair<basic_string<char>,_vector<vector<int>_>_>_>::value,_pair<iterator,_bool>_>
  _Var4;
  invalid_argument *e_55;
  invalid_argument *e_54;
  invalid_argument *e_53;
  invalid_argument *e_52;
  invalid_argument *e_51;
  invalid_argument *e_50;
  invalid_argument *e_49;
  invalid_argument *e_48;
  invalid_argument *e_47;
  invalid_argument *e_46;
  invalid_argument *e_45;
  invalid_argument *e_44;
  invalid_argument *e_43;
  invalid_argument *e_42;
  invalid_argument *e_41;
  invalid_argument *e_40;
  invalid_argument *e_39;
  invalid_argument *e_38;
  invalid_argument *e_37;
  invalid_argument *e_36;
  invalid_argument *e_35;
  invalid_argument *e_34;
  invalid_argument *e_33;
  invalid_argument *e_32;
  invalid_argument *e_31;
  invalid_argument *e_30;
  invalid_argument *e_29;
  invalid_argument *e_28;
  invalid_argument *e_27;
  invalid_argument *e_26;
  invalid_argument *e_25;
  invalid_argument *e_24;
  invalid_argument *e_23;
  invalid_argument *e_22;
  invalid_argument *e_21;
  invalid_argument *e_20;
  invalid_argument *e_19;
  invalid_argument *e_18;
  invalid_argument *e_17;
  invalid_argument *e_16;
  invalid_argument *e_15;
  invalid_argument *e_14;
  invalid_argument *e_13;
  invalid_argument *e_12;
  invalid_argument *e_11;
  invalid_argument *e_10;
  invalid_argument *e_9;
  invalid_argument *e_8;
  invalid_argument *e_7;
  invalid_argument *e_6;
  invalid_argument *e_5;
  invalid_argument *e_4;
  invalid_argument *e_3;
  invalid_argument *e_2;
  invalid_argument *e_1;
  invalid_argument *e;
  cartesian4 coordinate;
  int vertexIndex;
  vvint vertexToUpEdges;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *direction;
  iterator __end1;
  iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  directionList;
  undefined7 in_stack_ffffffffffffe998;
  undefined1 in_stack_ffffffffffffe99f;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
  in_stack_ffffffffffffe9a0;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>
  *__x;
  undefined4 in_stack_ffffffffffffe9b0;
  undefined4 in_stack_ffffffffffffe9b4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffe9b8;
  undefined4 in_stack_ffffffffffffe9c0;
  int in_stack_ffffffffffffe9c4;
  allocator_type *in_stack_ffffffffffffe9c8;
  allocator *paVar5;
  undefined4 in_stack_ffffffffffffe9d0;
  undefined4 in_stack_ffffffffffffe9d4;
  undefined8 in_stack_ffffffffffffe9d8;
  undefined4 in_stack_ffffffffffffe9e0;
  undefined4 in_stack_ffffffffffffe9e4;
  string *local_ed8;
  allocator local_de9;
  string local_de8 [36];
  undefined4 local_dc4;
  allocator local_db1;
  string local_db0 [36];
  undefined4 local_d8c;
  allocator local_d79;
  string local_d78 [36];
  undefined4 local_d54;
  allocator local_d41;
  string local_d40 [36];
  undefined4 local_d1c;
  allocator local_d09;
  string local_d08 [36];
  undefined4 local_ce4;
  allocator local_cd1;
  string local_cd0 [36];
  undefined4 local_cac;
  allocator local_c99;
  string local_c98 [36];
  undefined4 local_c74;
  allocator local_c61;
  string local_c60 [36];
  undefined4 local_c3c;
  allocator local_c29;
  string local_c28 [36];
  undefined4 local_c04;
  allocator local_bf1;
  string local_bf0 [36];
  undefined4 local_bcc;
  allocator local_bb9;
  string local_bb8 [36];
  undefined4 local_b94;
  allocator local_b81;
  string local_b80 [36];
  undefined4 local_b5c;
  allocator local_b49;
  string local_b48 [36];
  undefined4 local_b24;
  allocator local_b11;
  string local_b10 [36];
  undefined4 local_aec;
  allocator local_ad9;
  string local_ad8 [36];
  undefined4 local_ab4;
  allocator local_aa1;
  string local_aa0 [36];
  undefined4 local_a7c;
  allocator local_a69;
  string local_a68 [36];
  undefined4 local_a44;
  allocator local_a31;
  string local_a30 [36];
  undefined4 local_a0c;
  allocator local_9f9;
  string local_9f8 [36];
  undefined4 local_9d4;
  allocator local_9c1;
  string local_9c0 [36];
  undefined4 local_99c;
  allocator local_989;
  string local_988 [36];
  undefined4 local_964;
  allocator local_951;
  string local_950 [36];
  undefined4 local_92c;
  allocator local_919;
  string local_918 [36];
  undefined4 local_8f4;
  allocator local_8e1;
  string local_8e0 [36];
  undefined4 local_8bc;
  allocator local_8a9;
  string local_8a8 [36];
  undefined4 local_884;
  allocator local_871;
  string local_870 [36];
  undefined4 local_84c;
  allocator local_839;
  string local_838 [36];
  undefined4 local_814;
  allocator local_801;
  string local_800 [36];
  undefined4 local_7dc;
  allocator local_7c9;
  string local_7c8 [36];
  undefined4 local_7a4;
  allocator local_791;
  string local_790 [36];
  undefined4 local_76c;
  allocator local_759;
  string local_758 [36];
  undefined4 local_734;
  allocator local_721;
  string local_720 [36];
  undefined4 local_6fc;
  allocator local_6e9;
  string local_6e8 [36];
  undefined4 local_6c4;
  allocator local_6b1;
  string local_6b0 [36];
  undefined4 local_68c;
  allocator local_679;
  string local_678 [36];
  undefined4 local_654;
  allocator local_641;
  string local_640 [36];
  undefined4 local_61c;
  allocator local_609;
  string local_608 [36];
  undefined4 local_5e4;
  allocator local_5d1;
  string local_5d0 [36];
  undefined4 local_5ac;
  allocator local_599;
  string local_598 [36];
  undefined4 local_574;
  allocator local_561;
  string local_560 [36];
  undefined4 local_53c;
  allocator local_529;
  string local_528 [36];
  undefined4 local_504;
  allocator local_4f1;
  string local_4f0 [36];
  undefined4 local_4cc;
  allocator local_4b9;
  string local_4b8 [36];
  undefined4 local_494;
  allocator local_481;
  string local_480 [36];
  undefined4 local_45c;
  allocator local_449;
  string local_448 [36];
  undefined4 local_424;
  allocator local_411;
  string local_410 [36];
  undefined4 local_3ec;
  allocator local_3d9;
  string local_3d8 [36];
  undefined4 local_3b4;
  allocator local_3a1;
  string local_3a0 [36];
  undefined4 local_37c;
  allocator local_369;
  string local_368 [36];
  undefined4 local_344;
  allocator local_331;
  string local_330 [36];
  undefined4 local_30c;
  allocator local_2f9;
  string local_2f8 [36];
  undefined4 local_2d4;
  allocator local_2c1;
  string local_2c0 [36];
  undefined4 local_29c;
  allocator local_289;
  string local_288 [36];
  undefined4 local_264;
  allocator local_251;
  string local_250 [36];
  undefined4 local_22c;
  allocator local_219;
  string local_218 [36];
  undefined4 local_1f4;
  allocator local_1e1;
  string local_1e0 [32];
  undefined4 local_1c0;
  cartesian4 local_1bc;
  int local_1ac;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  undefined8 local_198;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  local_190;
  reference local_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_170;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_168;
  undefined1 *local_160;
  undefined1 local_154;
  allocator local_153;
  allocator local_152;
  allocator local_151;
  allocator local_150;
  allocator local_14f;
  allocator local_14e;
  allocator local_14d [20];
  allocator local_139;
  string *local_138;
  string local_130 [32];
  string local_110 [32];
  string local_f0 [32];
  string local_d0 [32];
  string local_b0 [32];
  string local_90 [32];
  string local_70 [32];
  string local_50 [32];
  string *local_30;
  undefined8 local_28;
  undefined1 local_20 [32];
  
  local_154 = 1;
  local_138 = local_130;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_130,"xyz",&local_139);
  local_138 = local_110;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_110,"xy",local_14d);
  local_138 = local_f0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_f0,"xz",&local_14e);
  local_138 = local_d0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_d0,"yz",&local_14f);
  local_138 = local_b0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b0,"-xyz",&local_150);
  local_138 = local_90;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_90,"-xy",&local_151);
  local_138 = local_70;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_70,"-xz",&local_152);
  local_138 = local_50;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_50,"-yz",&local_153);
  local_154 = 0;
  local_30 = local_130;
  local_28 = 8;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)0x17a5d8);
  __l._M_len._0_4_ = in_stack_ffffffffffffe9e0;
  __l._M_array = (iterator)in_stack_ffffffffffffe9d8;
  __l._M_len._4_4_ = in_stack_ffffffffffffe9e4;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)CONCAT44(in_stack_ffffffffffffe9d4,in_stack_ffffffffffffe9d0),__l,
           in_stack_ffffffffffffe9c8);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)0x17a60c);
  local_ed8 = (string *)&local_30;
  do {
    local_ed8 = local_ed8 + -0x20;
    std::__cxx11::string::~string(local_ed8);
  } while (local_ed8 != local_130);
  std::allocator<char>::~allocator((allocator<char> *)&local_153);
  std::allocator<char>::~allocator((allocator<char> *)&local_152);
  std::allocator<char>::~allocator((allocator<char> *)&local_151);
  std::allocator<char>::~allocator((allocator<char> *)&local_150);
  std::allocator<char>::~allocator((allocator<char> *)&local_14f);
  std::allocator<char>::~allocator((allocator<char> *)&local_14e);
  std::allocator<char>::~allocator((allocator<char> *)local_14d);
  std::allocator<char>::~allocator((allocator<char> *)&local_139);
  local_160 = local_20;
  local_168._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)CONCAT17(in_stack_ffffffffffffe99f,in_stack_ffffffffffffe998));
  local_170 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)CONCAT17(in_stack_ffffffffffffe99f,in_stack_ffffffffffffe998));
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)in_stack_ffffffffffffe9a0._M_node,
                       (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)CONCAT17(in_stack_ffffffffffffe99f,in_stack_ffffffffffffe998));
    if (!bVar1) break;
    local_178 = __gnu_cxx::
                __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator*(&local_168);
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              *)0x17a74a);
    local_1a8 = 0;
    uStack_1a0 = 0;
    local_198 = 0;
    std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x17a795);
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::assign((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              *)in_stack_ffffffffffffe9a0._M_node,
             CONCAT17(in_stack_ffffffffffffe99f,in_stack_ffffffffffffe998),(value_type *)0x17a7b2);
    std::vector<int,_std::allocator<int>_>::~vector
              ((vector<int,_std::allocator<int>_> *)
               CONCAT44(in_stack_ffffffffffffe9b4,in_stack_ffffffffffffe9b0));
    for (local_1ac = 0; local_1ac < (int)in_RDI[1] * 2 * (int)in_RDI[1] * (int)in_RDI[1];
        local_1ac = local_1ac + 1) {
      cVar3 = Lattice::indexToCoordinate
                        ((Lattice *)CONCAT44(in_stack_ffffffffffffe9c4,in_stack_ffffffffffffe9c0),
                         (int)((ulong)in_stack_ffffffffffffe9b8 >> 0x20));
      local_1bc.w = cVar3.w;
      local_1bc.z = cVar3.z;
      local_1bc.x = cVar3.x;
      local_1bc.y = cVar3.y;
      local_1bc = cVar3;
      if (local_1bc.w == 0) {
        iVar2 = local_1bc.x + local_1bc.y + local_1bc.z;
        if (iVar2 % 2 == 1) {
          bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)in_stack_ffffffffffffe9a0._M_node,
                                  (char *)CONCAT17(in_stack_ffffffffffffe99f,
                                                   in_stack_ffffffffffffe998));
          if (bVar1) {
            std::
            vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            ::operator[](&local_190,(long)local_1ac);
            iVar2 = local_1ac;
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_1e0,"xyz",&local_1e1);
            local_1c0 = (**(code **)(*in_RDI + 0x10))(in_RDI,iVar2,local_1e0,1);
            std::vector<int,_std::allocator<int>_>::push_back
                      ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffe9a0._M_node,
                       (value_type_conflict1 *)
                       CONCAT17(in_stack_ffffffffffffe99f,in_stack_ffffffffffffe998));
            std::__cxx11::string::~string(local_1e0);
            std::allocator<char>::~allocator((allocator<char> *)&local_1e1);
            std::
            vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            ::operator[](&local_190,(long)local_1ac);
            iVar2 = local_1ac;
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_218,"xy",&local_219);
            local_1f4 = (**(code **)(*in_RDI + 0x10))(in_RDI,iVar2,local_218,1);
            std::vector<int,_std::allocator<int>_>::push_back
                      ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffe9a0._M_node,
                       (value_type_conflict1 *)
                       CONCAT17(in_stack_ffffffffffffe99f,in_stack_ffffffffffffe998));
            std::__cxx11::string::~string(local_218);
            std::allocator<char>::~allocator((allocator<char> *)&local_219);
            std::
            vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            ::operator[](&local_190,(long)local_1ac);
            iVar2 = local_1ac;
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_250,"xz",&local_251);
            local_22c = (**(code **)(*in_RDI + 0x10))(in_RDI,iVar2,local_250,1);
            std::vector<int,_std::allocator<int>_>::push_back
                      ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffe9a0._M_node,
                       (value_type_conflict1 *)
                       CONCAT17(in_stack_ffffffffffffe99f,in_stack_ffffffffffffe998));
            std::__cxx11::string::~string(local_250);
            std::allocator<char>::~allocator((allocator<char> *)&local_251);
            std::
            vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            ::operator[](&local_190,(long)local_1ac);
            iVar2 = local_1ac;
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_288,"yz",&local_289);
            local_264 = (**(code **)(*in_RDI + 0x10))(in_RDI,iVar2,local_288,1);
            std::vector<int,_std::allocator<int>_>::push_back
                      ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffe9a0._M_node,
                       (value_type_conflict1 *)
                       CONCAT17(in_stack_ffffffffffffe99f,in_stack_ffffffffffffe998));
            std::__cxx11::string::~string(local_288);
            std::allocator<char>::~allocator((allocator<char> *)&local_289);
          }
          else {
            bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)in_stack_ffffffffffffe9a0._M_node,
                                    (char *)CONCAT17(in_stack_ffffffffffffe99f,
                                                     in_stack_ffffffffffffe998));
            if (bVar1) {
              std::
              vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              ::operator[](&local_190,(long)local_1ac);
              iVar2 = local_1ac;
              std::allocator<char>::allocator();
              std::__cxx11::string::string(local_2c0,"yz",&local_2c1);
              local_29c = (**(code **)(*in_RDI + 0x10))(in_RDI,iVar2,local_2c0,1);
              std::vector<int,_std::allocator<int>_>::push_back
                        ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffe9a0._M_node,
                         (value_type_conflict1 *)
                         CONCAT17(in_stack_ffffffffffffe99f,in_stack_ffffffffffffe998));
              std::__cxx11::string::~string(local_2c0);
              std::allocator<char>::~allocator((allocator<char> *)&local_2c1);
              std::
              vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              ::operator[](&local_190,(long)local_1ac);
              iVar2 = local_1ac;
              std::allocator<char>::allocator();
              std::__cxx11::string::string(local_2f8,"xyz",&local_2f9);
              local_2d4 = (**(code **)(*in_RDI + 0x10))(in_RDI,iVar2,local_2f8,1);
              std::vector<int,_std::allocator<int>_>::push_back
                        ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffe9a0._M_node,
                         (value_type_conflict1 *)
                         CONCAT17(in_stack_ffffffffffffe99f,in_stack_ffffffffffffe998));
              std::__cxx11::string::~string(local_2f8);
              std::allocator<char>::~allocator((allocator<char> *)&local_2f9);
              std::
              vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              ::operator[](&local_190,(long)local_1ac);
              iVar2 = local_1ac;
              std::allocator<char>::allocator();
              std::__cxx11::string::string(local_330,"xy",&local_331);
              local_30c = (**(code **)(*in_RDI + 0x10))(in_RDI,iVar2,local_330,0xffffffff);
              std::vector<int,_std::allocator<int>_>::push_back
                        ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffe9a0._M_node,
                         (value_type_conflict1 *)
                         CONCAT17(in_stack_ffffffffffffe99f,in_stack_ffffffffffffe998));
              std::__cxx11::string::~string(local_330);
              std::allocator<char>::~allocator((allocator<char> *)&local_331);
              std::
              vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              ::operator[](&local_190,(long)local_1ac);
              iVar2 = local_1ac;
              std::allocator<char>::allocator();
              std::__cxx11::string::string(local_368,"xz",&local_369);
              local_344 = (**(code **)(*in_RDI + 0x10))(in_RDI,iVar2,local_368,0xffffffff);
              std::vector<int,_std::allocator<int>_>::push_back
                        ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffe9a0._M_node,
                         (value_type_conflict1 *)
                         CONCAT17(in_stack_ffffffffffffe99f,in_stack_ffffffffffffe998));
              std::__cxx11::string::~string(local_368);
              std::allocator<char>::~allocator((allocator<char> *)&local_369);
            }
            else {
              bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)in_stack_ffffffffffffe9a0._M_node,
                                      (char *)CONCAT17(in_stack_ffffffffffffe99f,
                                                       in_stack_ffffffffffffe998));
              if (bVar1) {
                std::
                vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                ::operator[](&local_190,(long)local_1ac);
                iVar2 = local_1ac;
                std::allocator<char>::allocator();
                std::__cxx11::string::string(local_3a0,"xyz",&local_3a1);
                local_37c = (**(code **)(*in_RDI + 0x10))(in_RDI,iVar2,local_3a0,1);
                std::vector<int,_std::allocator<int>_>::push_back
                          ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffe9a0._M_node,
                           (value_type_conflict1 *)
                           CONCAT17(in_stack_ffffffffffffe99f,in_stack_ffffffffffffe998));
                std::__cxx11::string::~string(local_3a0);
                std::allocator<char>::~allocator((allocator<char> *)&local_3a1);
                std::
                vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                ::operator[](&local_190,(long)local_1ac);
                iVar2 = local_1ac;
                std::allocator<char>::allocator();
                std::__cxx11::string::string(local_3d8,"xz",&local_3d9);
                local_3b4 = (**(code **)(*in_RDI + 0x10))(in_RDI,iVar2,local_3d8,1);
                std::vector<int,_std::allocator<int>_>::push_back
                          ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffe9a0._M_node,
                           (value_type_conflict1 *)
                           CONCAT17(in_stack_ffffffffffffe99f,in_stack_ffffffffffffe998));
                std::__cxx11::string::~string(local_3d8);
                std::allocator<char>::~allocator((allocator<char> *)&local_3d9);
                std::
                vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                ::operator[](&local_190,(long)local_1ac);
                iVar2 = local_1ac;
                std::allocator<char>::allocator();
                std::__cxx11::string::string(local_410,"xy",&local_411);
                local_3ec = (**(code **)(*in_RDI + 0x10))(in_RDI,iVar2,local_410,0xffffffff);
                std::vector<int,_std::allocator<int>_>::push_back
                          ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffe9a0._M_node,
                           (value_type_conflict1 *)
                           CONCAT17(in_stack_ffffffffffffe99f,in_stack_ffffffffffffe998));
                std::__cxx11::string::~string(local_410);
                std::allocator<char>::~allocator((allocator<char> *)&local_411);
                std::
                vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                ::operator[](&local_190,(long)local_1ac);
                iVar2 = local_1ac;
                std::allocator<char>::allocator();
                std::__cxx11::string::string(local_448,"yz",&local_449);
                local_424 = (**(code **)(*in_RDI + 0x10))(in_RDI,iVar2,local_448,0xffffffff);
                std::vector<int,_std::allocator<int>_>::push_back
                          ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffe9a0._M_node,
                           (value_type_conflict1 *)
                           CONCAT17(in_stack_ffffffffffffe99f,in_stack_ffffffffffffe998));
                std::__cxx11::string::~string(local_448);
                std::allocator<char>::~allocator((allocator<char> *)&local_449);
              }
              else {
                bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)in_stack_ffffffffffffe9a0._M_node,
                                        (char *)CONCAT17(in_stack_ffffffffffffe99f,
                                                         in_stack_ffffffffffffe998));
                if (bVar1) {
                  std::
                  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  ::operator[](&local_190,(long)local_1ac);
                  iVar2 = local_1ac;
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string(local_480,"xyz",&local_481);
                  local_45c = (**(code **)(*in_RDI + 0x10))(in_RDI,iVar2,local_480,1);
                  std::vector<int,_std::allocator<int>_>::push_back
                            ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffe9a0._M_node,
                             (value_type_conflict1 *)
                             CONCAT17(in_stack_ffffffffffffe99f,in_stack_ffffffffffffe998));
                  std::__cxx11::string::~string(local_480);
                  std::allocator<char>::~allocator((allocator<char> *)&local_481);
                  std::
                  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  ::operator[](&local_190,(long)local_1ac);
                  iVar2 = local_1ac;
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string(local_4b8,"xy",&local_4b9);
                  local_494 = (**(code **)(*in_RDI + 0x10))(in_RDI,iVar2,local_4b8,1);
                  std::vector<int,_std::allocator<int>_>::push_back
                            ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffe9a0._M_node,
                             (value_type_conflict1 *)
                             CONCAT17(in_stack_ffffffffffffe99f,in_stack_ffffffffffffe998));
                  std::__cxx11::string::~string(local_4b8);
                  std::allocator<char>::~allocator((allocator<char> *)&local_4b9);
                  std::
                  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  ::operator[](&local_190,(long)local_1ac);
                  iVar2 = local_1ac;
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string(local_4f0,"xz",&local_4f1);
                  local_4cc = (**(code **)(*in_RDI + 0x10))(in_RDI,iVar2,local_4f0,0xffffffff);
                  std::vector<int,_std::allocator<int>_>::push_back
                            ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffe9a0._M_node,
                             (value_type_conflict1 *)
                             CONCAT17(in_stack_ffffffffffffe99f,in_stack_ffffffffffffe998));
                  std::__cxx11::string::~string(local_4f0);
                  std::allocator<char>::~allocator((allocator<char> *)&local_4f1);
                  std::
                  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  ::operator[](&local_190,(long)local_1ac);
                  iVar2 = local_1ac;
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string(local_528,"yz",&local_529);
                  local_504 = (**(code **)(*in_RDI + 0x10))(in_RDI,iVar2,local_528,0xffffffff);
                  std::vector<int,_std::allocator<int>_>::push_back
                            ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffe9a0._M_node,
                             (value_type_conflict1 *)
                             CONCAT17(in_stack_ffffffffffffe99f,in_stack_ffffffffffffe998));
                  std::__cxx11::string::~string(local_528);
                  std::allocator<char>::~allocator((allocator<char> *)&local_529);
                }
                else {
                  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)in_stack_ffffffffffffe9a0._M_node,
                                          (char *)CONCAT17(in_stack_ffffffffffffe99f,
                                                           in_stack_ffffffffffffe998));
                  if (bVar1) {
                    std::
                    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                    ::operator[](&local_190,(long)local_1ac);
                    iVar2 = local_1ac;
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string(local_560,"xyz",&local_561);
                    local_53c = (**(code **)(*in_RDI + 0x10))(in_RDI,iVar2,local_560,0xffffffff);
                    std::vector<int,_std::allocator<int>_>::push_back
                              ((vector<int,_std::allocator<int>_> *)
                               in_stack_ffffffffffffe9a0._M_node,
                               (value_type_conflict1 *)
                               CONCAT17(in_stack_ffffffffffffe99f,in_stack_ffffffffffffe998));
                    std::__cxx11::string::~string(local_560);
                    std::allocator<char>::~allocator((allocator<char> *)&local_561);
                    std::
                    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                    ::operator[](&local_190,(long)local_1ac);
                    iVar2 = local_1ac;
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string(local_598,"xz",&local_599);
                    local_574 = (**(code **)(*in_RDI + 0x10))(in_RDI,iVar2,local_598,0xffffffff);
                    std::vector<int,_std::allocator<int>_>::push_back
                              ((vector<int,_std::allocator<int>_> *)
                               in_stack_ffffffffffffe9a0._M_node,
                               (value_type_conflict1 *)
                               CONCAT17(in_stack_ffffffffffffe99f,in_stack_ffffffffffffe998));
                    std::__cxx11::string::~string(local_598);
                    std::allocator<char>::~allocator((allocator<char> *)&local_599);
                    std::
                    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                    ::operator[](&local_190,(long)local_1ac);
                    iVar2 = local_1ac;
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string(local_5d0,"xy",&local_5d1);
                    local_5ac = (**(code **)(*in_RDI + 0x10))(in_RDI,iVar2,local_5d0,0xffffffff);
                    std::vector<int,_std::allocator<int>_>::push_back
                              ((vector<int,_std::allocator<int>_> *)
                               in_stack_ffffffffffffe9a0._M_node,
                               (value_type_conflict1 *)
                               CONCAT17(in_stack_ffffffffffffe99f,in_stack_ffffffffffffe998));
                    std::__cxx11::string::~string(local_5d0);
                    std::allocator<char>::~allocator((allocator<char> *)&local_5d1);
                    std::
                    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                    ::operator[](&local_190,(long)local_1ac);
                    iVar2 = local_1ac;
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string(local_608,"yz",&local_609);
                    local_5e4 = (**(code **)(*in_RDI + 0x10))(in_RDI,iVar2,local_608,0xffffffff);
                    std::vector<int,_std::allocator<int>_>::push_back
                              ((vector<int,_std::allocator<int>_> *)
                               in_stack_ffffffffffffe9a0._M_node,
                               (value_type_conflict1 *)
                               CONCAT17(in_stack_ffffffffffffe99f,in_stack_ffffffffffffe998));
                    std::__cxx11::string::~string(local_608);
                    std::allocator<char>::~allocator((allocator<char> *)&local_609);
                  }
                  else {
                    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)in_stack_ffffffffffffe9a0._M_node,
                                            (char *)CONCAT17(in_stack_ffffffffffffe99f,
                                                             in_stack_ffffffffffffe998));
                    if (bVar1) {
                      std::
                      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                      ::operator[](&local_190,(long)local_1ac);
                      iVar2 = local_1ac;
                      std::allocator<char>::allocator();
                      std::__cxx11::string::string(local_640,"xy",&local_641);
                      local_61c = (**(code **)(*in_RDI + 0x10))(in_RDI,iVar2,local_640,1);
                      std::vector<int,_std::allocator<int>_>::push_back
                                ((vector<int,_std::allocator<int>_> *)
                                 in_stack_ffffffffffffe9a0._M_node,
                                 (value_type_conflict1 *)
                                 CONCAT17(in_stack_ffffffffffffe99f,in_stack_ffffffffffffe998));
                      std::__cxx11::string::~string(local_640);
                      std::allocator<char>::~allocator((allocator<char> *)&local_641);
                      std::
                      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                      ::operator[](&local_190,(long)local_1ac);
                      iVar2 = local_1ac;
                      std::allocator<char>::allocator();
                      std::__cxx11::string::string(local_678,"xz",&local_679);
                      local_654 = (**(code **)(*in_RDI + 0x10))(in_RDI,iVar2,local_678,1);
                      std::vector<int,_std::allocator<int>_>::push_back
                                ((vector<int,_std::allocator<int>_> *)
                                 in_stack_ffffffffffffe9a0._M_node,
                                 (value_type_conflict1 *)
                                 CONCAT17(in_stack_ffffffffffffe99f,in_stack_ffffffffffffe998));
                      std::__cxx11::string::~string(local_678);
                      std::allocator<char>::~allocator((allocator<char> *)&local_679);
                      std::
                      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                      ::operator[](&local_190,(long)local_1ac);
                      iVar2 = local_1ac;
                      std::allocator<char>::allocator();
                      std::__cxx11::string::string(local_6b0,"xyz",&local_6b1);
                      local_68c = (**(code **)(*in_RDI + 0x10))(in_RDI,iVar2,local_6b0,0xffffffff);
                      std::vector<int,_std::allocator<int>_>::push_back
                                ((vector<int,_std::allocator<int>_> *)
                                 in_stack_ffffffffffffe9a0._M_node,
                                 (value_type_conflict1 *)
                                 CONCAT17(in_stack_ffffffffffffe99f,in_stack_ffffffffffffe998));
                      std::__cxx11::string::~string(local_6b0);
                      std::allocator<char>::~allocator((allocator<char> *)&local_6b1);
                      std::
                      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                      ::operator[](&local_190,(long)local_1ac);
                      iVar2 = local_1ac;
                      std::allocator<char>::allocator();
                      std::__cxx11::string::string(local_6e8,"yz",&local_6e9);
                      local_6c4 = (**(code **)(*in_RDI + 0x10))(in_RDI,iVar2,local_6e8,0xffffffff);
                      std::vector<int,_std::allocator<int>_>::push_back
                                ((vector<int,_std::allocator<int>_> *)
                                 in_stack_ffffffffffffe9a0._M_node,
                                 (value_type_conflict1 *)
                                 CONCAT17(in_stack_ffffffffffffe99f,in_stack_ffffffffffffe998));
                      std::__cxx11::string::~string(local_6e8);
                      std::allocator<char>::~allocator((allocator<char> *)&local_6e9);
                    }
                    else {
                      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                               *)in_stack_ffffffffffffe9a0._M_node,
                                              (char *)CONCAT17(in_stack_ffffffffffffe99f,
                                                               in_stack_ffffffffffffe998));
                      if (bVar1) {
                        std::
                        vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                        ::operator[](&local_190,(long)local_1ac);
                        iVar2 = local_1ac;
                        std::allocator<char>::allocator();
                        std::__cxx11::string::string(local_720,"xy",&local_721);
                        local_6fc = (**(code **)(*in_RDI + 0x10))(in_RDI,iVar2,local_720,1);
                        std::vector<int,_std::allocator<int>_>::push_back
                                  ((vector<int,_std::allocator<int>_> *)
                                   in_stack_ffffffffffffe9a0._M_node,
                                   (value_type_conflict1 *)
                                   CONCAT17(in_stack_ffffffffffffe99f,in_stack_ffffffffffffe998));
                        std::__cxx11::string::~string(local_720);
                        std::allocator<char>::~allocator((allocator<char> *)&local_721);
                        std::
                        vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                        ::operator[](&local_190,(long)local_1ac);
                        iVar2 = local_1ac;
                        std::allocator<char>::allocator();
                        std::__cxx11::string::string(local_758,"yz",&local_759);
                        local_734 = (**(code **)(*in_RDI + 0x10))(in_RDI,iVar2,local_758,1);
                        std::vector<int,_std::allocator<int>_>::push_back
                                  ((vector<int,_std::allocator<int>_> *)
                                   in_stack_ffffffffffffe9a0._M_node,
                                   (value_type_conflict1 *)
                                   CONCAT17(in_stack_ffffffffffffe99f,in_stack_ffffffffffffe998));
                        std::__cxx11::string::~string(local_758);
                        std::allocator<char>::~allocator((allocator<char> *)&local_759);
                        std::
                        vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                        ::operator[](&local_190,(long)local_1ac);
                        iVar2 = local_1ac;
                        std::allocator<char>::allocator();
                        std::__cxx11::string::string(local_790,"xyz",&local_791);
                        local_76c = (**(code **)(*in_RDI + 0x10))(in_RDI,iVar2,local_790,0xffffffff)
                        ;
                        std::vector<int,_std::allocator<int>_>::push_back
                                  ((vector<int,_std::allocator<int>_> *)
                                   in_stack_ffffffffffffe9a0._M_node,
                                   (value_type_conflict1 *)
                                   CONCAT17(in_stack_ffffffffffffe99f,in_stack_ffffffffffffe998));
                        std::__cxx11::string::~string(local_790);
                        std::allocator<char>::~allocator((allocator<char> *)&local_791);
                        std::
                        vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                        ::operator[](&local_190,(long)local_1ac);
                        iVar2 = local_1ac;
                        std::allocator<char>::allocator();
                        std::__cxx11::string::string(local_7c8,"xz",&local_7c9);
                        local_7a4 = (**(code **)(*in_RDI + 0x10))(in_RDI,iVar2,local_7c8,0xffffffff)
                        ;
                        std::vector<int,_std::allocator<int>_>::push_back
                                  ((vector<int,_std::allocator<int>_> *)
                                   in_stack_ffffffffffffe9a0._M_node,
                                   (value_type_conflict1 *)
                                   CONCAT17(in_stack_ffffffffffffe99f,in_stack_ffffffffffffe998));
                        std::__cxx11::string::~string(local_7c8);
                        std::allocator<char>::~allocator((allocator<char> *)&local_7c9);
                      }
                      else {
                        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                 *)in_stack_ffffffffffffe9a0._M_node,
                                                (char *)CONCAT17(in_stack_ffffffffffffe99f,
                                                                 in_stack_ffffffffffffe998));
                        if (bVar1) {
                          std::
                          vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                          ::operator[](&local_190,(long)local_1ac);
                          iVar2 = local_1ac;
                          std::allocator<char>::allocator();
                          std::__cxx11::string::string(local_800,"xz",&local_801);
                          local_7dc = (**(code **)(*in_RDI + 0x10))(in_RDI,iVar2,local_800,1);
                          std::vector<int,_std::allocator<int>_>::push_back
                                    ((vector<int,_std::allocator<int>_> *)
                                     in_stack_ffffffffffffe9a0._M_node,
                                     (value_type_conflict1 *)
                                     CONCAT17(in_stack_ffffffffffffe99f,in_stack_ffffffffffffe998));
                          std::__cxx11::string::~string(local_800);
                          std::allocator<char>::~allocator((allocator<char> *)&local_801);
                          std::
                          vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                          ::operator[](&local_190,(long)local_1ac);
                          iVar2 = local_1ac;
                          std::allocator<char>::allocator();
                          std::__cxx11::string::string(local_838,"yz",&local_839);
                          local_814 = (**(code **)(*in_RDI + 0x10))(in_RDI,iVar2,local_838,1);
                          std::vector<int,_std::allocator<int>_>::push_back
                                    ((vector<int,_std::allocator<int>_> *)
                                     in_stack_ffffffffffffe9a0._M_node,
                                     (value_type_conflict1 *)
                                     CONCAT17(in_stack_ffffffffffffe99f,in_stack_ffffffffffffe998));
                          std::__cxx11::string::~string(local_838);
                          std::allocator<char>::~allocator((allocator<char> *)&local_839);
                          std::
                          vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                          ::operator[](&local_190,(long)local_1ac);
                          iVar2 = local_1ac;
                          std::allocator<char>::allocator();
                          std::__cxx11::string::string(local_870,"xyz",&local_871);
                          local_84c = (**(code **)(*in_RDI + 0x10))
                                                (in_RDI,iVar2,local_870,0xffffffff);
                          std::vector<int,_std::allocator<int>_>::push_back
                                    ((vector<int,_std::allocator<int>_> *)
                                     in_stack_ffffffffffffe9a0._M_node,
                                     (value_type_conflict1 *)
                                     CONCAT17(in_stack_ffffffffffffe99f,in_stack_ffffffffffffe998));
                          std::__cxx11::string::~string(local_870);
                          std::allocator<char>::~allocator((allocator<char> *)&local_871);
                          std::
                          vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                          ::operator[](&local_190,(long)local_1ac);
                          iVar2 = local_1ac;
                          std::allocator<char>::allocator();
                          std::__cxx11::string::string(local_8a8,"xy",&local_8a9);
                          local_884 = (**(code **)(*in_RDI + 0x10))
                                                (in_RDI,iVar2,local_8a8,0xffffffff);
                          std::vector<int,_std::allocator<int>_>::push_back
                                    ((vector<int,_std::allocator<int>_> *)
                                     in_stack_ffffffffffffe9a0._M_node,
                                     (value_type_conflict1 *)
                                     CONCAT17(in_stack_ffffffffffffe99f,in_stack_ffffffffffffe998));
                          std::__cxx11::string::~string(local_8a8);
                          std::allocator<char>::~allocator((allocator<char> *)&local_8a9);
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
      else if ((local_1bc.x + local_1bc.y + local_1bc.z) % 2 == 1) {
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )in_stack_ffffffffffffe9a0._M_node,
                                (char *)CONCAT17(in_stack_ffffffffffffe99f,in_stack_ffffffffffffe998
                                                ));
        if (!bVar1) {
          bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)in_stack_ffffffffffffe9a0._M_node,
                                  (char *)CONCAT17(in_stack_ffffffffffffe99f,
                                                   in_stack_ffffffffffffe998));
          if (!bVar1) {
            bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)in_stack_ffffffffffffe9a0._M_node,
                                    (char *)CONCAT17(in_stack_ffffffffffffe99f,
                                                     in_stack_ffffffffffffe998));
            if (!bVar1) {
              bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)in_stack_ffffffffffffe9a0._M_node,
                                      (char *)CONCAT17(in_stack_ffffffffffffe99f,
                                                       in_stack_ffffffffffffe998));
              if (!bVar1) {
                bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)in_stack_ffffffffffffe9a0._M_node,
                                        (char *)CONCAT17(in_stack_ffffffffffffe99f,
                                                         in_stack_ffffffffffffe998));
                if (bVar1) {
                  std::
                  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  ::operator[](&local_190,(long)local_1ac);
                  iVar2 = local_1ac;
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string(local_8e0,"xy",&local_8e1);
                  local_8bc = (**(code **)(*in_RDI + 0x10))(in_RDI,iVar2,local_8e0,1);
                  std::vector<int,_std::allocator<int>_>::push_back
                            ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffe9a0._M_node,
                             (value_type_conflict1 *)
                             CONCAT17(in_stack_ffffffffffffe99f,in_stack_ffffffffffffe998));
                  std::__cxx11::string::~string(local_8e0);
                  std::allocator<char>::~allocator((allocator<char> *)&local_8e1);
                  std::
                  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  ::operator[](&local_190,(long)local_1ac);
                  iVar2 = local_1ac;
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string(local_918,"xz",&local_919);
                  local_8f4 = (**(code **)(*in_RDI + 0x10))(in_RDI,iVar2,local_918,1);
                  std::vector<int,_std::allocator<int>_>::push_back
                            ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffe9a0._M_node,
                             (value_type_conflict1 *)
                             CONCAT17(in_stack_ffffffffffffe99f,in_stack_ffffffffffffe998));
                  std::__cxx11::string::~string(local_918);
                  std::allocator<char>::~allocator((allocator<char> *)&local_919);
                  std::
                  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  ::operator[](&local_190,(long)local_1ac);
                  iVar2 = local_1ac;
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string(local_950,"yz",&local_951);
                  local_92c = (**(code **)(*in_RDI + 0x10))(in_RDI,iVar2,local_950,1);
                  std::vector<int,_std::allocator<int>_>::push_back
                            ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffe9a0._M_node,
                             (value_type_conflict1 *)
                             CONCAT17(in_stack_ffffffffffffe99f,in_stack_ffffffffffffe998));
                  std::__cxx11::string::~string(local_950);
                  std::allocator<char>::~allocator((allocator<char> *)&local_951);
                }
                else {
                  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)in_stack_ffffffffffffe9a0._M_node,
                                          (char *)CONCAT17(in_stack_ffffffffffffe99f,
                                                           in_stack_ffffffffffffe998));
                  if (bVar1) {
                    std::
                    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                    ::operator[](&local_190,(long)local_1ac);
                    iVar2 = local_1ac;
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string(local_988,"xyz",&local_989);
                    local_964 = (**(code **)(*in_RDI + 0x10))(in_RDI,iVar2,local_988,0xffffffff);
                    std::vector<int,_std::allocator<int>_>::push_back
                              ((vector<int,_std::allocator<int>_> *)
                               in_stack_ffffffffffffe9a0._M_node,
                               (value_type_conflict1 *)
                               CONCAT17(in_stack_ffffffffffffe99f,in_stack_ffffffffffffe998));
                    std::__cxx11::string::~string(local_988);
                    std::allocator<char>::~allocator((allocator<char> *)&local_989);
                    std::
                    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                    ::operator[](&local_190,(long)local_1ac);
                    iVar2 = local_1ac;
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string(local_9c0,"xz",&local_9c1);
                    local_99c = (**(code **)(*in_RDI + 0x10))(in_RDI,iVar2,local_9c0,1);
                    std::vector<int,_std::allocator<int>_>::push_back
                              ((vector<int,_std::allocator<int>_> *)
                               in_stack_ffffffffffffe9a0._M_node,
                               (value_type_conflict1 *)
                               CONCAT17(in_stack_ffffffffffffe99f,in_stack_ffffffffffffe998));
                    std::__cxx11::string::~string(local_9c0);
                    std::allocator<char>::~allocator((allocator<char> *)&local_9c1);
                    std::
                    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                    ::operator[](&local_190,(long)local_1ac);
                    iVar2 = local_1ac;
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string(local_9f8,"yz",&local_9f9);
                    local_9d4 = (**(code **)(*in_RDI + 0x10))(in_RDI,iVar2,local_9f8,1);
                    std::vector<int,_std::allocator<int>_>::push_back
                              ((vector<int,_std::allocator<int>_> *)
                               in_stack_ffffffffffffe9a0._M_node,
                               (value_type_conflict1 *)
                               CONCAT17(in_stack_ffffffffffffe99f,in_stack_ffffffffffffe998));
                    std::__cxx11::string::~string(local_9f8);
                    std::allocator<char>::~allocator((allocator<char> *)&local_9f9);
                  }
                  else {
                    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)in_stack_ffffffffffffe9a0._M_node,
                                            (char *)CONCAT17(in_stack_ffffffffffffe99f,
                                                             in_stack_ffffffffffffe998));
                    if (bVar1) {
                      std::
                      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                      ::operator[](&local_190,(long)local_1ac);
                      iVar2 = local_1ac;
                      std::allocator<char>::allocator();
                      std::__cxx11::string::string(local_a30,"xyz",&local_a31);
                      local_a0c = (**(code **)(*in_RDI + 0x10))(in_RDI,iVar2,local_a30,0xffffffff);
                      std::vector<int,_std::allocator<int>_>::push_back
                                ((vector<int,_std::allocator<int>_> *)
                                 in_stack_ffffffffffffe9a0._M_node,
                                 (value_type_conflict1 *)
                                 CONCAT17(in_stack_ffffffffffffe99f,in_stack_ffffffffffffe998));
                      std::__cxx11::string::~string(local_a30);
                      std::allocator<char>::~allocator((allocator<char> *)&local_a31);
                      std::
                      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                      ::operator[](&local_190,(long)local_1ac);
                      iVar2 = local_1ac;
                      std::allocator<char>::allocator();
                      std::__cxx11::string::string(local_a68,"xy",&local_a69);
                      local_a44 = (**(code **)(*in_RDI + 0x10))(in_RDI,iVar2,local_a68,1);
                      std::vector<int,_std::allocator<int>_>::push_back
                                ((vector<int,_std::allocator<int>_> *)
                                 in_stack_ffffffffffffe9a0._M_node,
                                 (value_type_conflict1 *)
                                 CONCAT17(in_stack_ffffffffffffe99f,in_stack_ffffffffffffe998));
                      std::__cxx11::string::~string(local_a68);
                      std::allocator<char>::~allocator((allocator<char> *)&local_a69);
                      std::
                      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                      ::operator[](&local_190,(long)local_1ac);
                      iVar2 = local_1ac;
                      std::allocator<char>::allocator();
                      std::__cxx11::string::string(local_aa0,"yz",&local_aa1);
                      local_a7c = (**(code **)(*in_RDI + 0x10))(in_RDI,iVar2,local_aa0,1);
                      std::vector<int,_std::allocator<int>_>::push_back
                                ((vector<int,_std::allocator<int>_> *)
                                 in_stack_ffffffffffffe9a0._M_node,
                                 (value_type_conflict1 *)
                                 CONCAT17(in_stack_ffffffffffffe99f,in_stack_ffffffffffffe998));
                      std::__cxx11::string::~string(local_aa0);
                      std::allocator<char>::~allocator((allocator<char> *)&local_aa1);
                    }
                    else {
                      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                               *)in_stack_ffffffffffffe9a0._M_node,
                                              (char *)CONCAT17(in_stack_ffffffffffffe99f,
                                                               in_stack_ffffffffffffe998));
                      if (bVar1) {
                        std::
                        vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                        ::operator[](&local_190,(long)local_1ac);
                        iVar2 = local_1ac;
                        std::allocator<char>::allocator();
                        std::__cxx11::string::string(local_ad8,"xyz",&local_ad9);
                        local_ab4 = (**(code **)(*in_RDI + 0x10))(in_RDI,iVar2,local_ad8,0xffffffff)
                        ;
                        std::vector<int,_std::allocator<int>_>::push_back
                                  ((vector<int,_std::allocator<int>_> *)
                                   in_stack_ffffffffffffe9a0._M_node,
                                   (value_type_conflict1 *)
                                   CONCAT17(in_stack_ffffffffffffe99f,in_stack_ffffffffffffe998));
                        std::__cxx11::string::~string(local_ad8);
                        std::allocator<char>::~allocator((allocator<char> *)&local_ad9);
                        std::
                        vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                        ::operator[](&local_190,(long)local_1ac);
                        iVar2 = local_1ac;
                        std::allocator<char>::allocator();
                        std::__cxx11::string::string(local_b10,"xz",&local_b11);
                        local_aec = (**(code **)(*in_RDI + 0x10))(in_RDI,iVar2,local_b10,1);
                        std::vector<int,_std::allocator<int>_>::push_back
                                  ((vector<int,_std::allocator<int>_> *)
                                   in_stack_ffffffffffffe9a0._M_node,
                                   (value_type_conflict1 *)
                                   CONCAT17(in_stack_ffffffffffffe99f,in_stack_ffffffffffffe998));
                        std::__cxx11::string::~string(local_b10);
                        std::allocator<char>::~allocator((allocator<char> *)&local_b11);
                        std::
                        vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                        ::operator[](&local_190,(long)local_1ac);
                        iVar2 = local_1ac;
                        std::allocator<char>::allocator();
                        std::__cxx11::string::string(local_b48,"xy",&local_b49);
                        local_b24 = (**(code **)(*in_RDI + 0x10))(in_RDI,iVar2,local_b48,1);
                        std::vector<int,_std::allocator<int>_>::push_back
                                  ((vector<int,_std::allocator<int>_> *)
                                   in_stack_ffffffffffffe9a0._M_node,
                                   (value_type_conflict1 *)
                                   CONCAT17(in_stack_ffffffffffffe99f,in_stack_ffffffffffffe998));
                        std::__cxx11::string::~string(local_b48);
                        std::allocator<char>::~allocator((allocator<char> *)&local_b49);
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
      else {
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )in_stack_ffffffffffffe9a0._M_node,
                                (char *)CONCAT17(in_stack_ffffffffffffe99f,in_stack_ffffffffffffe998
                                                ));
        if (!bVar1) {
          bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)in_stack_ffffffffffffe9a0._M_node,
                                  (char *)CONCAT17(in_stack_ffffffffffffe99f,
                                                   in_stack_ffffffffffffe998));
          if (!bVar1) {
            bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)in_stack_ffffffffffffe9a0._M_node,
                                    (char *)CONCAT17(in_stack_ffffffffffffe99f,
                                                     in_stack_ffffffffffffe998));
            if (!bVar1) {
              bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)in_stack_ffffffffffffe9a0._M_node,
                                      (char *)CONCAT17(in_stack_ffffffffffffe99f,
                                                       in_stack_ffffffffffffe998));
              if (!bVar1) {
                bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)in_stack_ffffffffffffe9a0._M_node,
                                        (char *)CONCAT17(in_stack_ffffffffffffe99f,
                                                         in_stack_ffffffffffffe998));
                if (bVar1) {
                  std::
                  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  ::operator[](&local_190,(long)local_1ac);
                  iVar2 = local_1ac;
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string(local_b80,"xy",&local_b81);
                  local_b5c = (**(code **)(*in_RDI + 0x10))(in_RDI,iVar2,local_b80,0xffffffff);
                  std::vector<int,_std::allocator<int>_>::push_back
                            ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffe9a0._M_node,
                             (value_type_conflict1 *)
                             CONCAT17(in_stack_ffffffffffffe99f,in_stack_ffffffffffffe998));
                  std::__cxx11::string::~string(local_b80);
                  std::allocator<char>::~allocator((allocator<char> *)&local_b81);
                  std::
                  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  ::operator[](&local_190,(long)local_1ac);
                  iVar2 = local_1ac;
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string(local_bb8,"xz",&local_bb9);
                  local_b94 = (**(code **)(*in_RDI + 0x10))(in_RDI,iVar2,local_bb8,0xffffffff);
                  std::vector<int,_std::allocator<int>_>::push_back
                            ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffe9a0._M_node,
                             (value_type_conflict1 *)
                             CONCAT17(in_stack_ffffffffffffe99f,in_stack_ffffffffffffe998));
                  std::__cxx11::string::~string(local_bb8);
                  std::allocator<char>::~allocator((allocator<char> *)&local_bb9);
                  std::
                  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  ::operator[](&local_190,(long)local_1ac);
                  iVar2 = local_1ac;
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string(local_bf0,"yz",&local_bf1);
                  local_bcc = (**(code **)(*in_RDI + 0x10))(in_RDI,iVar2,local_bf0,0xffffffff);
                  std::vector<int,_std::allocator<int>_>::push_back
                            ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffe9a0._M_node,
                             (value_type_conflict1 *)
                             CONCAT17(in_stack_ffffffffffffe99f,in_stack_ffffffffffffe998));
                  std::__cxx11::string::~string(local_bf0);
                  std::allocator<char>::~allocator((allocator<char> *)&local_bf1);
                }
                else {
                  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)in_stack_ffffffffffffe9a0._M_node,
                                          (char *)CONCAT17(in_stack_ffffffffffffe99f,
                                                           in_stack_ffffffffffffe998));
                  if (bVar1) {
                    std::
                    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                    ::operator[](&local_190,(long)local_1ac);
                    iVar2 = local_1ac;
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string(local_c28,"xyz",&local_c29);
                    local_c04 = (**(code **)(*in_RDI + 0x10))(in_RDI,iVar2,local_c28,1);
                    std::vector<int,_std::allocator<int>_>::push_back
                              ((vector<int,_std::allocator<int>_> *)
                               in_stack_ffffffffffffe9a0._M_node,
                               (value_type_conflict1 *)
                               CONCAT17(in_stack_ffffffffffffe99f,in_stack_ffffffffffffe998));
                    std::__cxx11::string::~string(local_c28);
                    std::allocator<char>::~allocator((allocator<char> *)&local_c29);
                    std::
                    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                    ::operator[](&local_190,(long)local_1ac);
                    iVar2 = local_1ac;
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string(local_c60,"xz",&local_c61);
                    local_c3c = (**(code **)(*in_RDI + 0x10))(in_RDI,iVar2,local_c60,0xffffffff);
                    std::vector<int,_std::allocator<int>_>::push_back
                              ((vector<int,_std::allocator<int>_> *)
                               in_stack_ffffffffffffe9a0._M_node,
                               (value_type_conflict1 *)
                               CONCAT17(in_stack_ffffffffffffe99f,in_stack_ffffffffffffe998));
                    std::__cxx11::string::~string(local_c60);
                    std::allocator<char>::~allocator((allocator<char> *)&local_c61);
                    std::
                    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                    ::operator[](&local_190,(long)local_1ac);
                    iVar2 = local_1ac;
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string(local_c98,"yz",&local_c99);
                    local_c74 = (**(code **)(*in_RDI + 0x10))(in_RDI,iVar2,local_c98,0xffffffff);
                    std::vector<int,_std::allocator<int>_>::push_back
                              ((vector<int,_std::allocator<int>_> *)
                               in_stack_ffffffffffffe9a0._M_node,
                               (value_type_conflict1 *)
                               CONCAT17(in_stack_ffffffffffffe99f,in_stack_ffffffffffffe998));
                    std::__cxx11::string::~string(local_c98);
                    std::allocator<char>::~allocator((allocator<char> *)&local_c99);
                  }
                  else {
                    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)in_stack_ffffffffffffe9a0._M_node,
                                            (char *)CONCAT17(in_stack_ffffffffffffe99f,
                                                             in_stack_ffffffffffffe998));
                    if (bVar1) {
                      std::
                      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                      ::operator[](&local_190,(long)local_1ac);
                      iVar2 = local_1ac;
                      std::allocator<char>::allocator();
                      std::__cxx11::string::string(local_cd0,"xyz",&local_cd1);
                      local_cac = (**(code **)(*in_RDI + 0x10))(in_RDI,iVar2,local_cd0,1);
                      std::vector<int,_std::allocator<int>_>::push_back
                                ((vector<int,_std::allocator<int>_> *)
                                 in_stack_ffffffffffffe9a0._M_node,
                                 (value_type_conflict1 *)
                                 CONCAT17(in_stack_ffffffffffffe99f,in_stack_ffffffffffffe998));
                      std::__cxx11::string::~string(local_cd0);
                      std::allocator<char>::~allocator((allocator<char> *)&local_cd1);
                      std::
                      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                      ::operator[](&local_190,(long)local_1ac);
                      iVar2 = local_1ac;
                      std::allocator<char>::allocator();
                      std::__cxx11::string::string(local_d08,"xy",&local_d09);
                      local_ce4 = (**(code **)(*in_RDI + 0x10))(in_RDI,iVar2,local_d08,0xffffffff);
                      std::vector<int,_std::allocator<int>_>::push_back
                                ((vector<int,_std::allocator<int>_> *)
                                 in_stack_ffffffffffffe9a0._M_node,
                                 (value_type_conflict1 *)
                                 CONCAT17(in_stack_ffffffffffffe99f,in_stack_ffffffffffffe998));
                      std::__cxx11::string::~string(local_d08);
                      std::allocator<char>::~allocator((allocator<char> *)&local_d09);
                      std::
                      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                      ::operator[](&local_190,(long)local_1ac);
                      iVar2 = local_1ac;
                      std::allocator<char>::allocator();
                      std::__cxx11::string::string(local_d40,"yz",&local_d41);
                      local_d1c = (**(code **)(*in_RDI + 0x10))(in_RDI,iVar2,local_d40,0xffffffff);
                      std::vector<int,_std::allocator<int>_>::push_back
                                ((vector<int,_std::allocator<int>_> *)
                                 in_stack_ffffffffffffe9a0._M_node,
                                 (value_type_conflict1 *)
                                 CONCAT17(in_stack_ffffffffffffe99f,in_stack_ffffffffffffe998));
                      std::__cxx11::string::~string(local_d40);
                      std::allocator<char>::~allocator((allocator<char> *)&local_d41);
                    }
                    else {
                      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                               *)in_stack_ffffffffffffe9a0._M_node,
                                              (char *)CONCAT17(in_stack_ffffffffffffe99f,
                                                               in_stack_ffffffffffffe998));
                      if (bVar1) {
                        std::
                        vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                        ::operator[](&local_190,(long)local_1ac);
                        iVar2 = local_1ac;
                        std::allocator<char>::allocator();
                        std::__cxx11::string::string(local_d78,"xyz",&local_d79);
                        local_d54 = (**(code **)(*in_RDI + 0x10))(in_RDI,iVar2,local_d78,1);
                        std::vector<int,_std::allocator<int>_>::push_back
                                  ((vector<int,_std::allocator<int>_> *)
                                   in_stack_ffffffffffffe9a0._M_node,
                                   (value_type_conflict1 *)
                                   CONCAT17(in_stack_ffffffffffffe99f,in_stack_ffffffffffffe998));
                        std::__cxx11::string::~string(local_d78);
                        std::allocator<char>::~allocator((allocator<char> *)&local_d79);
                        std::
                        vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                        ::operator[](&local_190,(long)local_1ac);
                        iVar2 = local_1ac;
                        std::allocator<char>::allocator();
                        std::__cxx11::string::string(local_db0,"xz",&local_db1);
                        local_d8c = (**(code **)(*in_RDI + 0x10))(in_RDI,iVar2,local_db0,0xffffffff)
                        ;
                        std::vector<int,_std::allocator<int>_>::push_back
                                  ((vector<int,_std::allocator<int>_> *)
                                   in_stack_ffffffffffffe9a0._M_node,
                                   (value_type_conflict1 *)
                                   CONCAT17(in_stack_ffffffffffffe99f,in_stack_ffffffffffffe998));
                        std::__cxx11::string::~string(local_db0);
                        std::allocator<char>::~allocator((allocator<char> *)&local_db1);
                        in_stack_ffffffffffffe9b8 =
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             std::
                             vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                             ::operator[](&local_190,(long)local_1ac);
                        paVar5 = &local_de9;
                        in_stack_ffffffffffffe9c4 = local_1ac;
                        std::allocator<char>::allocator();
                        std::__cxx11::string::string(local_de8,"xy",paVar5);
                        in_stack_ffffffffffffe9b4 =
                             (**(code **)(*in_RDI + 0x10))
                                       (in_RDI,in_stack_ffffffffffffe9c4,local_de8,0xffffffff);
                        local_dc4 = in_stack_ffffffffffffe9b4;
                        std::vector<int,_std::allocator<int>_>::push_back
                                  ((vector<int,_std::allocator<int>_> *)
                                   in_stack_ffffffffffffe9a0._M_node,
                                   (value_type_conflict1 *)
                                   CONCAT17(in_stack_ffffffffffffe99f,in_stack_ffffffffffffe998));
                        std::__cxx11::string::~string(local_de8);
                        std::allocator<char>::~allocator((allocator<char> *)&local_de9);
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    __x = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>
           *)(in_RDI + 0xb);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>
    ::
    pair<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_&,_true>
              ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>
                *)CONCAT44(in_stack_ffffffffffffe9c4,in_stack_ffffffffffffe9c0),
               in_stack_ffffffffffffe9b8,
               (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                *)CONCAT44(in_stack_ffffffffffffe9b4,in_stack_ffffffffffffe9b0));
    _Var4 = std::
            map<std::__cxx11::string,std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>>>>
            ::
            insert<std::pair<std::__cxx11::string,std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>>>
                      ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>_>
                        *)CONCAT44(in_stack_ffffffffffffe9b4,in_stack_ffffffffffffe9b0),__x);
    in_stack_ffffffffffffe9a0 = _Var4.first._M_node;
    in_stack_ffffffffffffe99f = _Var4.second;
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>
    ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>
             *)in_stack_ffffffffffffe9a0._M_node);
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               *)CONCAT44(in_stack_ffffffffffffe9b4,in_stack_ffffffffffffe9b0));
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&local_168);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)CONCAT44(in_stack_ffffffffffffe9b4,in_stack_ffffffffffffe9b0));
  return;
}

Assistant:

void RhombicLattice::createUpEdgesMap()
{
    std::vector<std::string> directionList = {"xyz", "xy", "xz", "yz",
                                              "-xyz", "-xy", "-xz", "-yz"};
    for (const auto &direction : directionList)
    {
        vvint vertexToUpEdges;
        vertexToUpEdges.assign(2 * l * l * l, {});
        for (int vertexIndex = 0; vertexIndex < 2 * l * l * l; ++vertexIndex)
        {
            cartesian4 coordinate = indexToCoordinate(vertexIndex);
            if (coordinate.w == 0)
            {
                if ((coordinate.x + coordinate.y + coordinate.z) % 2 == 1)
                {
                    if (direction == "xyz")
                    {
                        // Third argument is sign
                        try
                        {
                            vertexToUpEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "xyz", 1));
                        }
                        catch (const std::invalid_argument &e)
                        {
                            // Edge includes vertex outside lattice
                        }
                        try
                        {
                            vertexToUpEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "xy", 1));
                        }
                        catch (const std::invalid_argument &e)
                        {
                        }
                        try
                        {
                            vertexToUpEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "xz", 1));
                        }
                        catch (const std::invalid_argument &e)
                        {
                        }
                        try
                        {
                            vertexToUpEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "yz", 1));
                        }
                        catch (const std::invalid_argument &e)
                        {
                        }
                    }
                    else if (direction == "yz")
                    {
                        try
                        {
                            vertexToUpEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "yz", 1));
                        }
                        catch (const std::invalid_argument &e)
                        {
                        }
                        try
                        {
                            vertexToUpEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "xyz", 1));
                        }
                        catch (const std::invalid_argument &e)
                        {
                        }
                        try
                        {
                            vertexToUpEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "xy", -1));
                        }
                        catch (const std::invalid_argument &e)
                        {
                        }
                        try
                        {
                            vertexToUpEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "xz", -1));
                        }
                        catch (const std::invalid_argument &e)
                        {
                        }
                    }
                    else if (direction == "xz")
                    {
                        try
                        {
                            vertexToUpEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "xyz", 1));
                        }
                        catch (const std::invalid_argument &e)
                        {
                        }
                        try
                        {
                            vertexToUpEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "xz", 1));
                        }
                        catch (const std::invalid_argument &e)
                        {
                        }
                        try
                        {
                            vertexToUpEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "xy", -1));
                        }
                        catch (const std::invalid_argument &e)
                        {
                        }
                        try
                        {
                            vertexToUpEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "yz", -1));
                        }
                        catch (const std::invalid_argument &e)
                        {
                        }
                    }
                    else if (direction == "xy")
                    {
                        try
                        {
                            vertexToUpEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "xyz", 1));
                        }
                        catch (const std::invalid_argument &e)
                        {
                        }
                        try
                        {
                            vertexToUpEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "xy", 1));
                        }
                        catch (const std::invalid_argument &e)
                        {
                        }
                        try
                        {
                            vertexToUpEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "xz", -1));
                        }
                        catch (const std::invalid_argument &e)
                        {
                        }
                        try
                        {
                            vertexToUpEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "yz", -1));
                        }
                        catch (const std::invalid_argument &e)
                        {
                        }
                    }
                    else if (direction == "-xyz")
                    {
                        try
                        {
                            vertexToUpEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "xyz", -1));
                        }
                        catch (const std::invalid_argument &e)
                        {
                        }
                        try
                        {
                            vertexToUpEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "xz", -1));
                        }
                        catch (const std::invalid_argument &e)
                        {
                        }
                        try
                        {
                            vertexToUpEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "xy", -1));
                        }
                        catch (const std::invalid_argument &e)
                        {
                        }
                        try
                        {
                            vertexToUpEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "yz", -1));
                        }
                        catch (const std::invalid_argument &e)
                        {
                        }
                    }
                    else if (direction == "-yz")
                    {
                        try
                        {
                            vertexToUpEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "xy", 1));
                        }
                        catch (const std::invalid_argument &e)
                        {
                        }
                        try
                        {
                            vertexToUpEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "xz", 1));
                        }
                        catch (const std::invalid_argument &e)
                        {
                        }
                        try
                        {
                            vertexToUpEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "xyz", -1));
                        }
                        catch (const std::invalid_argument &e)
                        {
                        }
                        try
                        {
                            vertexToUpEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "yz", -1));
                        }
                        catch (std::invalid_argument &e)
                        {
                        }
                    }
                    else if (direction == "-xz")
                    {
                        try
                        {
                            vertexToUpEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "xy", 1));
                        }
                        catch (std::invalid_argument &e)
                        {
                        }
                        try
                        {
                            vertexToUpEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "yz", 1));
                        }
                        catch (std::invalid_argument &e)
                        {
                        }
                        try
                        {
                            vertexToUpEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "xyz", -1));
                        }
                        catch (std::invalid_argument &e)
                        {
                        }
                        try
                        {
                            vertexToUpEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "xz", -1));
                        }
                        catch (std::invalid_argument &e)
                        {
                        }
                    }
                    else if (direction == "-xy")
                    {
                        try
                        {
                            vertexToUpEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "xz", 1));
                        }
                        catch (std::invalid_argument &e)
                        {
                        }
                        try
                        {
                            vertexToUpEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "yz", 1));
                        }
                        catch (std::invalid_argument &e)
                        {
                        }
                        try
                        {
                            vertexToUpEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "xyz", -1));
                        }
                        catch (std::invalid_argument &e)
                        {
                        }
                        try
                        {
                            vertexToUpEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "xy", -1));
                        }
                        catch (std::invalid_argument &e)
                        {
                        }
                    }
                }
            }
            else
            {
                if ((coordinate.x + coordinate.y + coordinate.z) % 2 == 1)
                {
                    if (direction == "xy" || direction == "xz" || direction == "yz" || direction == "-xyz")
                    {
                        // Only one up edge, so return an empty vector as no sweep will happen here.
                    }
                    else
                    {
                        if (direction == "xyz")
                        {
                            try
                            {
                                vertexToUpEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "xy", 1));
                            }
                            catch (std::invalid_argument &e)
                            {
                            }
                            try
                            {
                                vertexToUpEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "xz", 1));
                            }
                            catch (std::invalid_argument &e)
                            {
                            }
                            try
                            {
                                vertexToUpEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "yz", 1));
                            }
                            catch (std::invalid_argument &e)
                            {
                            }
                        }
                        else if (direction == "-xy")
                        {
                            try
                            {
                                vertexToUpEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "xyz", -1));
                            }
                            catch (std::invalid_argument &e)
                            {
                            }
                            try
                            {
                                vertexToUpEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "xz", 1));
                            }
                            catch (std::invalid_argument &e)
                            {
                            }
                            try
                            {
                                vertexToUpEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "yz", 1));
                            }
                            catch (std::invalid_argument &e)
                            {
                            }
                        }
                        else if (direction == "-xz")
                        {
                            try
                            {
                                vertexToUpEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "xyz", -1));
                            }
                            catch (std::invalid_argument &e)
                            {
                            }
                            try
                            {
                                vertexToUpEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "xy", 1));
                            }
                            catch (std::invalid_argument &e)
                            {
                            }
                            try
                            {
                                vertexToUpEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "yz", 1));
                            }
                            catch (std::invalid_argument &e)
                            {
                            }
                        }
                        else if (direction == "-yz")
                        {
                            try
                            {
                                vertexToUpEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "xyz", -1));
                            }
                            catch (std::invalid_argument &e)
                            {
                            }
                            try
                            {
                                vertexToUpEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "xz", 1));
                            }
                            catch (std::invalid_argument &e)
                            {
                            }
                            try
                            {
                                vertexToUpEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "xy", 1));
                            }
                            catch (std::invalid_argument &e)
                            {
                            }
                        }
                    }
                }
                else
                {
                    if (direction == "-xy" || direction == "-xz" || direction == "-yz" || direction == "xyz")
                    {
                        // Only one up edge, so return an empty vector as no sweep will happen here.
                    }
                    else
                    {
                        if (direction == "-xyz")
                        {
                            try
                            {
                                vertexToUpEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "xy", -1));
                            }
                            catch (std::invalid_argument &e)
                            {
                            }
                            try
                            {
                                vertexToUpEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "xz", -1));
                            }
                            catch (std::invalid_argument &e)
                            {
                            }
                            try
                            {
                                vertexToUpEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "yz", -1));
                            }
                            catch (std::invalid_argument &e)
                            {
                            }
                        }
                        else if (direction == "xy")
                        {
                            try
                            {
                                vertexToUpEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "xyz", 1));
                            }
                            catch (std::invalid_argument &e)
                            {
                            }
                            try
                            {
                                vertexToUpEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "xz", -1));
                            }
                            catch (std::invalid_argument &e)
                            {
                            }
                            try
                            {
                                vertexToUpEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "yz", -1));
                            }
                            catch (std::invalid_argument &e)
                            {
                            }
                        }
                        else if (direction == "xz")
                        {
                            try
                            {
                                vertexToUpEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "xyz", 1));
                            }
                            catch (std::invalid_argument &e)
                            {
                            }
                            try
                            {
                                vertexToUpEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "xy", -1));
                            }
                            catch (std::invalid_argument &e)
                            {
                            }
                            try
                            {
                                vertexToUpEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "yz", -1));
                            }
                            catch (std::invalid_argument &e)
                            {
                            }
                        }
                        else if (direction == "yz")
                        {
                            try
                            {
                                vertexToUpEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "xyz", 1));
                            }
                            catch (std::invalid_argument &e)
                            {
                            }
                            try
                            {
                                vertexToUpEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "xz", -1));
                            }
                            catch (std::invalid_argument &e)
                            {
                            }
                            try
                            {
                                vertexToUpEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "xy", -1));
                            }
                            catch (std::invalid_argument &e)
                            {
                            }
                        }
                    }
                }
            }
        }
        upEdgesMap.insert(std::pair<std::string, vvint>(direction, vertexToUpEdges));
    }
}